

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O3

void __thiscall dg::llvmdg::SDG2Dot::dump(SDG2Dot *this,string *file)

{
  set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_> *this_00;
  _Head_base<0UL,_dg::sdg::DependenceGraph_*,_false> _Var1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  DGElement *pDVar5;
  DGNode *call;
  SDG2Dot *this_01;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  pointer puVar9;
  long *plVar10;
  undefined8 *puVar11;
  DGElement *nd_00;
  DGParameters *params;
  DGNode *nd;
  DGNodeCall *C;
  set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  calls;
  ofstream out;
  DGNode *local_2c0;
  SDG2Dot *local_2b8;
  DGNode *local_2b0;
  string local_2a8;
  _Base_ptr local_288;
  pointer local_280;
  DGParameters *local_278;
  pointer local_270;
  long *local_268;
  _Rb_tree<dg::sdg::DGNodeCall_*,_dg::sdg::DGNodeCall_*,_std::_Identity<dg::sdg::DGNodeCall_*>,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  local_260;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ofstream *)&local_230,(string *)file,_S_out);
  local_260._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_260._M_impl.super__Rb_tree_header._M_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_260._M_impl.super__Rb_tree_header._M_header._M_right =
       local_260._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"digraph SDG {\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"  compound=\"true\"\n",0x12);
  puVar9 = (this->_llvmsdg->_sdg)._graphs.
           super__Vector_base<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_280 = (this->_llvmsdg->_sdg)._graphs.
              super__Vector_base<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>,_std::allocator<std::unique_ptr<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8 = this;
  if (puVar9 != local_280) {
    this_00 = &this->dumpedNodes;
    local_288 = &(this->dumpedNodes)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      _Var1._M_head_impl =
           (puVar9->_M_t).
           super___uniq_ptr_impl<dg::sdg::DependenceGraph,_std::default_delete<dg::sdg::DependenceGraph>_>
           ._M_t.
           super__Tuple_impl<0UL,_dg::sdg::DependenceGraph_*,_std::default_delete<dg::sdg::DependenceGraph>_>
           .super__Head_base<0UL,_dg::sdg::DependenceGraph_*,_false>._M_head_impl;
      local_270 = puVar9;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"  subgraph cluster_dg_",0x16);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," {\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"    color=black;\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"    style=filled;\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"    fillcolor=grey95;\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"    label=\"",0xb);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,*(char **)(_Var1._M_head_impl + 0xa8),
                          *(long *)(_Var1._M_head_impl + 0xb0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," (id ",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\";\n",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"formal parameters","");
      local_278 = (DGParameters *)(_Var1._M_head_impl + 0x10);
      dumpParams(this,(ostream *)&local_230,(DGParameters *)(_Var1._M_head_impl + 0x10),&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      plVar10 = *(long **)(_Var1._M_head_impl + 0x60);
      local_268 = *(long **)(_Var1._M_head_impl + 0x68);
      if (plVar10 != local_268) {
        do {
          lVar2 = *plVar10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"    subgraph cluster_dg_",0x18);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_bb_",4);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," {\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"      label=\"bblock #",0x15);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
          puVar3 = *(undefined8 **)(lVar2 + 0x140);
          for (puVar11 = *(undefined8 **)(lVar2 + 0x138); puVar11 != puVar3; puVar11 = puVar11 + 1)
          {
            local_2c0 = (DGNode *)*puVar11;
            std::
            _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
            ::_M_insert_unique<dg::sdg::DGNode*const&>
                      ((_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                        *)this_00,&local_2c0);
            dumpNode(this,(ostream *)&local_230,local_2c0,(Value *)0x0,(char *)0x0);
            local_2b0 = local_2c0;
            if (*(int *)(local_2c0 + 0xc) != 6) {
              local_2b0 = (DGNode *)0x0;
            }
            if (local_2b0 != (DGNode *)0x0) {
              std::
              _Rb_tree<dg::sdg::DGNodeCall*,dg::sdg::DGNodeCall*,std::_Identity<dg::sdg::DGNodeCall*>,std::less<dg::sdg::DGNodeCall*>,std::allocator<dg::sdg::DGNodeCall*>>
              ::_M_insert_unique<dg::sdg::DGNodeCall*const&>
                        ((_Rb_tree<dg::sdg::DGNodeCall*,dg::sdg::DGNodeCall*,std::_Identity<dg::sdg::DGNodeCall*>,std::less<dg::sdg::DGNodeCall*>,std::allocator<dg::sdg::DGNodeCall*>>
                          *)&local_260,(DGNodeCall **)&local_2b0);
              params = (DGParameters *)(local_2b0 + 0x170);
              local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2a8,"actual parameters","");
              dumpParams(this,(ostream *)&local_230,params,&local_2a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"    }\n",6);
          plVar10 = plVar10 + 1;
        } while (plVar10 != local_268);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"    /* edges */\n",0x10);
      puVar3 = *(undefined8 **)(_Var1._M_head_impl + 0x50);
      for (puVar11 = *(undefined8 **)(_Var1._M_head_impl + 0x48); puVar11 != puVar3;
          puVar11 = puVar11 + 1) {
        dumpEdges(this,(ostream *)&local_230,(DGNode *)*puVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"    /* block edges */\n",0x16);
      plVar4 = *(long **)(_Var1._M_head_impl + 0x68);
      for (plVar10 = *(long **)(_Var1._M_head_impl + 0x60); plVar10 != plVar4; plVar10 = plVar10 + 1
          ) {
        lVar2 = *plVar10;
        for (p_Var7 = *(_Rb_tree_node_base **)(lVar2 + 0x120);
            p_Var7 != (_Rb_tree_node_base *)(lVar2 + 0x110);
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          pDVar5 = *(DGElement **)(p_Var7 + 1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"    ",4);
          operator<<((ostream *)&local_230,*(DGElement **)(*(long *)(lVar2 + 0x140) + -8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," -> ",4);
          nd_00 = pDVar5;
          if (pDVar5 != (DGElement *)0x0 && *(int *)(pDVar5 + 0xc) == 2) {
            nd_00 = (DGElement *)**(undefined8 **)(pDVar5 + 0x138);
          }
          operator<<((ostream *)&local_230,nd_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"[color=blue penwidth=2 ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230," ltail=cluster_dg_",0x12);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_bb_",4);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          if (*(int *)(pDVar5 + 0xc) == 2) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230," lhead=cluster_dg_",0x12);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_bb_",4);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"]\n",2);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  }\n",4);
      this = local_2b8;
      dumpParamEdges(local_2b8,(ostream *)&local_230,local_278);
      std::
      _Rb_tree<dg::sdg::DGNode_*,_dg::sdg::DGNode_*,_std::_Identity<dg::sdg::DGNode_*>,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
      ::_M_erase(&this_00->_M_t,
                 (_Link_type)
                 (this->dumpedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      (this->dumpedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this->dumpedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_288;
      (this->dumpedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_288;
      (this->dumpedNodes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      puVar9 = local_270 + 1;
    } while (puVar9 != local_280);
  }
  if (local_260._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230," /* call and param edges */\n",0x1c);
  }
  if ((_Rb_tree_header *)local_260._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_260._M_impl.super__Rb_tree_header) {
    p_Var8 = local_260._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      this_01 = local_2b8;
      call = *(DGNode **)(p_Var8 + 1);
      bindParamsToCall(local_2b8,(ostream *)&local_230,(DGParameters *)(call + 0x170),call);
      dumpParamEdges(this_01,(ostream *)&local_230,(DGParameters *)(call + 0x170));
      for (p_Var7 = *(_Rb_tree_node_base **)(call + 0x158);
          p_Var7 != (_Rb_tree_node_base *)(call + 0x148);
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        lVar2 = *(long *)(p_Var7 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"  ",2);
        operator<<((ostream *)&local_230,(DGElement *)call);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," -> ",4);
        operator<<((ostream *)&local_230,(DGElement *)**(undefined8 **)(lVar2 + 0x48));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"[lhead=cluster_dg_",0x12);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," label=\"call \'",0xe);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,*(char **)(lVar2 + 0xa8),*(long *)(lVar2 + 0xb0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\"",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," style=dashed penwidth=3]\n",0x1a);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_260._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}\n",2);
  std::
  _Rb_tree<dg::sdg::DGNodeCall_*,_dg::sdg::DGNodeCall_*,_std::_Identity<dg::sdg::DGNodeCall_*>,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  ::_M_erase(&local_260,(_Link_type)local_260._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void dump(const std::string &file) const {
        std::ofstream out(file);
        std::set<sdg::DGNodeCall *> calls;

        out << "digraph SDG {\n";
        out << "  compound=\"true\"\n";

        for (auto *dg : _llvmsdg->getSDG()) {
            ///
            // Dependence graphs (functions)
            out << "  subgraph cluster_dg_" << dg->getID() << " {\n";
            out << "    color=black;\n";
            out << "    style=filled;\n";
            out << "    fillcolor=grey95;\n";
            out << "    label=\"" << dg->getName() << " (id " << dg->getID()
                << ")\";\n";
            out << "\n";

            ///
            // Parameters of the DG
            //
            /// Formal input parameters
            dumpParams(out, dg->getParameters(), "formal parameters");

            ///
            // Basic blocks
            for (auto *blk : dg->getBBlocks()) {
                out << "    subgraph cluster_dg_" << dg->getID() << "_bb_"
                    << blk->getID() << " {\n";
                out << "      label=\"bblock #" << blk->getID() << "\"\n";
                for (auto *nd : blk->getNodes()) {
                    dumpedNodes.insert(nd);
                    dumpNode(out, *nd);

                    if (auto *C = sdg::DGNodeCall::get(nd)) {
                        // store the node for later use (dumping of call edges
                        // etc.)
                        calls.insert(C);
                        // dump actual parameters
                        dumpParams(out, C->getParameters(),
                                   "actual parameters");
                    }
                }
                out << "    }\n";
            }

            ///
            // -- edges --
            out << "    /* edges */\n";
            for (auto *nd : dg->getNodes()) {
                dumpEdges(out, *nd);
            }
            out << "    /* block edges */\n";
            for (auto *blk : dg->getBBlocks()) {
                for (auto *ctrl : blk->controls()) {
                    out << "    " << *blk->back() << " -> ";
                    if (auto *ctrlB = sdg::DGBBlock::get(ctrl)) {
                        out << *ctrlB->front();
                    } else {
                        out << *ctrl;
                    }

                    out << "[color=blue penwidth=2 "
                        << " ltail=cluster_dg_" << dg->getID() << "_bb_"
                        << blk->getID();

                    if (ctrl->getType() == sdg::DGElementType::BBLOCK) {
                        out << " lhead=cluster_dg_" << dg->getID() << "_bb_"
                            << ctrl->getID();
                    }
                    out << "]\n";
                }
            }

            out << "  }\n";

            // formal parameters edges
            dumpParamEdges(out, dg->getParameters());

            dumpedNodes.clear();
        }

        ////
        // -- Interprocedural edges and parameter edges--

        if (!calls.empty()) {
            out << " /* call and param edges */\n";
        }
        for (auto *C : calls) {
            bindParamsToCall(out, C->getParameters(), C);
            dumpParamEdges(out, C->getParameters());
            for (auto *dg : C->getCallees()) {
                out << "  " << *C << " -> " << *dg->getFirstNode()
                    << "[lhead=cluster_dg_" << dg->getID() << " label=\"call '"
                    << dg->getName() << "'\""
                    << " style=dashed penwidth=3]\n";
            }
        }

        out << "}\n";
    }